

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntSortCompare1(int *pp1,int *pp2)

{
  int *pp2_local;
  int *pp1_local;
  
  if (*pp1 < *pp2) {
    pp1_local._4_4_ = -1;
  }
  else if (*pp2 < *pp1) {
    pp1_local._4_4_ = 1;
  }
  else {
    pp1_local._4_4_ = 0;
  }
  return pp1_local._4_4_;
}

Assistant:

static int Vec_IntSortCompare1( int * pp1, int * pp2 )
{
    // for some reason commenting out lines (as shown) led to crashing of the release version
    if ( *pp1 < *pp2 )
        return -1;
    if ( *pp1 > *pp2 ) //
        return 1;
    return 0; //
}